

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::QuerySurfaceSimpleWindowCase::executeForConfig
          (QuerySurfaceSimpleWindowCase *this,EGLDisplay display,EGLConfig config)

{
  WindowParams *this_00;
  deUint32 err;
  Visibility visibility_;
  Library *egl_00;
  TestLog *this_01;
  NativeDisplayFactory *factory;
  CommandLine *pCVar1;
  MessageBuilder *pMVar2;
  NativeDisplay *pNVar3;
  undefined8 uVar4;
  NativeWindow *window_00;
  EGLSurface pvVar5;
  undefined1 local_2a0 [8];
  UniqueSurface surface;
  undefined1 local_278 [8];
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> window;
  MessageBuilder local_258;
  undefined1 local_d8 [8];
  ConfigInfo info;
  NativeWindowFactory *windowFactory;
  int height;
  int width;
  TestLog *log;
  Library *egl;
  EGLConfig config_local;
  EGLDisplay display_local;
  QuerySurfaceSimpleWindowCase *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                      m_eglTestCtx);
  this_01 = tcu::TestContext::getLog
                      ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  factory = EglTestContext::getNativeDisplayFactory
                      ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                       m_eglTestCtx);
  pCVar1 = tcu::TestContext::getCommandLine
                     ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                      super_TestCase.super_TestNode.m_testCtx);
  info._144_8_ = eglu::selectNativeWindowFactory(factory,pCVar1);
  eglu::ConfigInfo::ConfigInfo((ConfigInfo *)local_d8);
  eglu::queryCoreConfigInfo(egl_00,display,config,(ConfigInfo *)local_d8);
  tcu::TestLog::operator<<(&local_258,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_258,(char (*) [40])"Creating window surface with config ID ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)&info.colorBufferType);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_258);
  err = (*egl_00->_vptr_Library[0x1f])();
  eglu::checkError(err,"before queries",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQuerySurfaceTests.cpp"
                   ,0x13b);
  uVar4 = info._144_8_;
  pNVar3 = EglTestContext::getNativeDisplay
                     ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                      m_eglTestCtx);
  pCVar1 = tcu::TestContext::getCommandLine
                     ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                      super_TestCase.super_TestNode.m_testCtx);
  visibility_ = eglu::parseWindowVisibility(pCVar1);
  this_00 = (WindowParams *)((long)&surface.m_surface + 4);
  eglu::WindowParams::WindowParams(this_00,0x40,0x40,visibility_);
  uVar4 = (**(code **)(*(long *)uVar4 + 0x20))(uVar4,pNVar3,display,config,0,this_00);
  de::DefaultDeleter<eglu::NativeWindow>::DefaultDeleter
            ((DefaultDeleter<eglu::NativeWindow> *)((long)&surface.m_surface + 3));
  de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::UniquePtr
            ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_278,
             uVar4);
  pNVar3 = EglTestContext::getNativeDisplay
                     ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                      m_eglTestCtx);
  window_00 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
              operator*((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                        local_278);
  pvVar5 = eglu::createWindowSurface(pNVar3,window_00,display,config,(EGLAttrib *)0x0);
  eglu::UniqueSurface::UniqueSurface((UniqueSurface *)local_2a0,egl_00,display,pvVar5);
  pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_2a0);
  logCommonSurfaceAttributes(this_01,egl_00,display,pvVar5);
  pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_2a0);
  QuerySurfaceCase::checkCommonAttributes
            (&this->super_QuerySurfaceCase,display,pvVar5,(ConfigInfo *)local_d8);
  pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_2a0);
  QuerySurfaceCase::checkNonPbufferAttributes(&this->super_QuerySurfaceCase,display,pvVar5);
  eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_2a0);
  de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~UniquePtr
            ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_278);
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&						egl				= m_eglTestCtx.getLibrary();
		tcu::TestLog&						log				= m_testCtx.getLog();
		const int							width			= 64;
		const int							height			= 64;
		const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
		ConfigInfo							info;

		eglu::queryCoreConfigInfo(egl, display, config, &info);

		log << TestLog::Message << "Creating window surface with config ID " << info.configId << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "before queries");

		de::UniquePtr<eglu::NativeWindow>	window	(windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(width, height, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
		eglu::UniqueSurface					surface	(egl, display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, display, config, DE_NULL));

		logCommonSurfaceAttributes	(log, egl, display, *surface);
		checkCommonAttributes		(display, *surface, info);
		checkNonPbufferAttributes	(display, *surface);
	}